

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3PcacheDrop(PgHdr *p)

{
  PgHdr *p_local;
  
  if ((p->flags & 2) != 0) {
    pcacheManageDirtyList(p,'\x01');
  }
  p->pCache->nRefSum = p->pCache->nRefSum + -1;
  (*sqlite3Config.pcache2.xUnpin)(p->pCache->pCache,p->pPage,1);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3PcacheDrop(PgHdr *p){
  assert( p->nRef==1 );
  assert( sqlite3PcachePageSanity(p) );
  if( p->flags&PGHDR_DIRTY ){
    pcacheManageDirtyList(p, PCACHE_DIRTYLIST_REMOVE);
  }
  p->pCache->nRefSum--;
  sqlite3GlobalConfig.pcache2.xUnpin(p->pCache->pCache, p->pPage, 1);
}